

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Str_t * Acb_GeneratePatch2(Gia_Man_t *pGia,Vec_Ptr_t *vIns,Vec_Ptr_t *vOuts)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int i;
  Vec_Wec_t *vGates;
  ulong uVar4;
  Vec_Ptr_t *p;
  Vec_Str_t *p_00;
  void *pvVar5;
  Vec_Int_t *p_01;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  
  vGates = Abc_GiaSynthesize((Vec_Ptr_t *)0x0,pGia);
  uVar1 = vIns->nSize;
  uVar4 = (ulong)uVar1;
  uVar2 = vOuts->nSize;
  iVar9 = vGates->nSize;
  p = Acb_GenerateSignalNames2(vGates,vIns,vOuts);
  p_00 = Vec_StrAlloc(100);
  Vec_StrAppend(p_00,"module patch (");
  for (iVar11 = 0; iVar11 < vOuts->nSize; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(vOuts,iVar11);
    pcVar6 = ",";
    if (iVar11 == 0) {
      pcVar6 = "";
    }
    Vec_StrPrintF(p_00,"%s %s",pcVar6,pvVar5);
  }
  for (iVar11 = 0; iVar11 < vIns->nSize; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(vIns,iVar11);
    Vec_StrPrintF(p_00,", %s",pvVar5);
  }
  Vec_StrAppend(p_00," );\n\n");
  Vec_StrAppend(p_00,"  output");
  for (iVar11 = 0; iVar11 < vOuts->nSize; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(vOuts,iVar11);
    pcVar6 = ",";
    if (iVar11 == 0) {
      pcVar6 = "";
    }
    Vec_StrPrintF(p_00,"%s %s",pcVar6,pvVar5);
  }
  Vec_StrAppend(p_00,";\n");
  Vec_StrAppend(p_00,"  input");
  for (iVar11 = 0; iVar11 < vIns->nSize; iVar11 = iVar11 + 1) {
    pvVar5 = Vec_PtrEntry(vIns,iVar11);
    pcVar6 = ",";
    if (iVar11 == 0) {
      pcVar6 = "";
    }
    Vec_StrPrintF(p_00,"%s %s",pcVar6,pvVar5);
  }
  uVar8 = iVar9 - (uVar1 + uVar2);
  Vec_StrAppend(p_00,";\n");
  if ((int)uVar2 < (int)uVar8) {
    Vec_StrAppend(p_00,"  wire");
    uVar12 = 0;
    if (0 < (int)uVar8) {
      uVar12 = uVar8;
    }
    bVar3 = true;
    uVar10 = uVar4;
    while (bVar13 = uVar12 != 0, uVar12 = uVar12 - 1, bVar13) {
      pcVar6 = (char *)Vec_PtrEntry(p,(int)uVar10);
      if ((*pcVar6 == 'w') && (pcVar6[1] == 'w')) {
        pcVar7 = "";
        if (!bVar3) {
          pcVar7 = ",";
        }
        bVar3 = false;
        Vec_StrPrintF(p_00,"%s %s",pcVar7,pcVar6);
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    }
    Vec_StrAppend(p_00,";\n\n");
  }
  uVar10 = uVar4;
  do {
    uVar12 = 1;
    iVar9 = (int)uVar10;
    if ((int)(uVar8 + uVar1) <= iVar9) {
      Vec_StrAppend(p_00,"\nendmodule\n\n");
      Vec_StrPush(p_00,'\0');
      Vec_PtrFreeFree(p);
      Vec_WecFree(vGates);
      printf("Synthesized patch with %d inputs, %d outputs and %d gates.\n",uVar4,(ulong)uVar2,
             (ulong)uVar8);
      return p_00;
    }
    p_01 = Vec_WecEntry(vGates,iVar9);
    iVar11 = p_01->nSize;
    i = Vec_IntEntry(p_01,0);
    if (iVar11 < 3) {
      if (i != 7) {
        iVar11 = Vec_IntEntry(p_01,0);
        if (iVar11 != 8) {
          __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x870,
                        "Vec_Str_t *Acb_GeneratePatch2(Gia_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
        }
      }
      Vec_StrPrintF(p_00,"  %s (","buf");
      iVar11 = Vec_IntEntry(p_01,1);
      pvVar5 = Vec_PtrEntry(p,iVar11);
      Vec_StrPrintF(p_00," %s, ",pvVar5);
      iVar11 = Vec_IntEntry(p_01,0);
      Vec_StrPrintF(p_00," 1\'b%d",(ulong)(iVar11 == 8));
      Vec_StrPrintF(p_00," );\n");
    }
    else {
      pcVar6 = Acb_Oper2Name(i);
      Vec_StrPrintF(p_00,"  %s (",pcVar6);
      for (; (int)uVar12 < p_01->nSize; uVar12 = uVar12 + 1) {
        iVar11 = Vec_IntEntry(p_01,uVar12);
        pcVar6 = "";
        if (1 < uVar12) {
          pcVar6 = ",";
        }
        pvVar5 = Vec_PtrEntry(p,iVar11);
        Vec_StrPrintF(p_00,"%s %s",pcVar6,pvVar5);
      }
      Vec_StrAppend(p_00," );\n");
    }
    uVar10 = (ulong)(iVar9 + 1);
  } while( true );
}

Assistant:

Vec_Str_t * Acb_GeneratePatch2( Gia_Man_t * pGia, Vec_Ptr_t * vIns, Vec_Ptr_t * vOuts )
{
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = Abc_GiaSynthesize( NULL, pGia );  Vec_Int_t * vGate;
    int nIns = Vec_PtrSize(vIns), nOuts = Vec_PtrSize(vOuts); char * pName;
    int i, k, iObj, nWires = Vec_WecSize(vGates) - nIns - nOuts, fFirst = 1;
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames2( vGates, vIns, vOuts );

    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_StrAppend( vStr, "module patch (" );

    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, ", %s", pName );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_PtrForEachEntry( char *, vOuts, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_PtrForEachEntry( char *, vIns, pName, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", pName );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, nIns+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, nIns, nIns+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

    printf( "Synthesized patch with %d inputs, %d outputs and %d gates.\n", nIns, nOuts, nWires );
    return vStr;
}